

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_36::HttpClientAdapter::connect
          (HttpClientAdapter *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Array<char> *pAVar1;
  long *plVar2;
  PromiseArena *pPVar3;
  undefined8 *puVar4;
  PromiseBase PVar5;
  Disposer *node;
  AsyncIoStream *pAVar6;
  ReducePromises<kj::HttpClient::ConnectRequest::Status> node_00;
  PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *pPVar7;
  size_t sVar8;
  ReducePromises<void> RVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  HttpClientAdapter *pHVar12;
  WeakFulfiller<kj::HttpClient::ConnectRequest::Status> *params;
  StringPtr *pSVar13;
  WeakFulfiller<void> *params_00;
  AsyncIoStreamWithGuards *this_00;
  void *pvVar14;
  HttpService *pHVar15;
  int __flags;
  undefined4 in_register_0000000c;
  long lVar16;
  size_t *psVar17;
  AsyncIoStream *pAVar18;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar19;
  long lVar20;
  undefined4 in_register_00000034;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *in_R9;
  PromiseNode *ptrCopy_2;
  ConnectResponseImpl *ptrCopy;
  TransformPromiseNodeBase *this_01;
  PromiseBase local_180;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_178;
  PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status> paf;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  PromiseBase local_140;
  String hostCopy;
  Refcounted *refcounted;
  PromiseFulfillerPair<void> paf_1;
  TwoWayPipe pipe;
  undefined1 local_e0 [48];
  HttpHeaders *pHStack_b0;
  ArrayDisposer *local_a8;
  Array<char> *local_a0;
  HttpClientAdapter *local_80;
  Disposer *local_78;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> local_70;
  undefined1 local_40 [8];
  undefined8 local_38;
  
  lVar16 = CONCAT44(in_register_0000000c,__len);
  lVar20 = lVar16;
  __arg = in_R8;
  heapString(&hostCopy,lVar16 - 1);
  __flags = (int)lVar20;
  pvVar14 = extraout_RDX;
  if (lVar16 - 1U != 0) {
    pcVar19 = (char *)hostCopy.content.size_;
    if (hostCopy.content.size_ != 0) {
      pcVar19 = hostCopy.content.ptr;
    }
    memcpy(pcVar19,__addr,lVar16 - 1U);
    pvVar14 = extraout_RDX_00;
  }
  HttpHeaders::clone((HttpHeaders *)local_e0,in_R8,pvVar14,__flags,__arg);
  heap<kj::HttpHeaders>((kj *)&headersCopy,(HttpHeaders *)local_e0);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_e0);
  newTwoWayPipe();
  params = (WeakFulfiller<kj::HttpClient::ConnectRequest::Status> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_00644450;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00644488;
  local_80 = this;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::HttpClient::ConnectRequest::Status>&>
            ((PromiseDisposer *)local_e0,params);
  paf.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_e0._0_8_;
  paf.fulfiller.disposer = &(params->super_WeakFulfillerBase).super_Disposer;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)params;
  pSVar13 = (StringPtr *)operator_new(0x50);
  pAVar6 = pipe.ends[0].ptr;
  pPVar7 = paf.fulfiller.ptr;
  paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0;
  local_78 = pipe.ends[0].disposer;
  pipe.ends[0].ptr = (AsyncIoStream *)0x0;
  psVar17 = &(pSVar13->content).size_;
  *(undefined4 *)&pSVar13[1].content.ptr = 0;
  (pSVar13->content).ptr = (char *)&PTR_accept_006418c8;
  (pSVar13->content).size_ = (size_t)&PTR_disposeImpl_006418f8;
  pSVar13[1].content.size_ = (size_t)&params->super_WeakFulfillerBase;
  pSVar13[2].content.ptr = (char *)pPVar7;
  params_00 = (WeakFulfiller<void> *)operator_new(0x18);
  (params_00->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params_00->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00629ab8;
  (params_00->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00629af0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)local_e0,params_00);
  paf_1.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_e0._0_8_;
  local_70.ptr._0_8_ = local_70.ptr._0_8_ & 0xffffffffffffff00;
  paf_1.fulfiller.disposer = &(params_00->super_WeakFulfillerBase).super_Disposer;
  paf_1.fulfiller.ptr = (PromiseFulfiller<void> *)params_00;
  this_00 = (AsyncIoStreamWithGuards *)operator_new(0x88);
  local_178.disposer = local_78;
  local_178.ptr = pAVar6;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
            ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)local_e0,
             &local_70);
  Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Promise
            ((Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             &local_180,
             (FixVoid<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             local_e0);
  local_140.node.ptr = (OwnPromiseNode)(OwnPromiseNode)paf_1.promise.super_PromiseBase.node.ptr;
  paf_1.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  AsyncIoStreamWithGuards::AsyncIoStreamWithGuards
            (this_00,&local_178,
             (Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *)
             &local_180,(Promise<void> *)&local_140);
  PVar5.node.ptr = local_140.node.ptr;
  if (local_140.node.ptr != (PromiseNode *)0x0) {
    local_140.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar5.node.ptr);
  }
  PVar5.node.ptr = local_180.node.ptr;
  if (local_180.node.ptr != (PromiseNode *)0x0) {
    local_180.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar5.node.ptr);
  }
  uVar11 = local_e0._16_8_;
  uVar10 = local_e0._8_8_;
  if ((local_e0[0] == (PromiseDisposer)0x1) && ((StringPtr *)local_e0._8_8_ != (StringPtr *)0x0)) {
    local_e0._8_8_ = (StringPtr *)0x0;
    local_e0._16_8_ = 0;
    (***(_func_int ***)local_e0._24_8_)(local_e0._24_8_,uVar10,1,uVar11,uVar11,0);
  }
  pAVar6 = local_178.ptr;
  if (local_178.ptr != (AsyncIoStream *)0x0) {
    local_178.ptr = (AsyncIoStream *)0x0;
    (**(local_178.disposer)->_vptr_Disposer)
              (local_178.disposer,
               (pAVar6->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar6->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  uVar11 = local_70.ptr.field_1.value.buffer.size_;
  uVar10 = local_70.ptr.field_1.value.buffer.ptr;
  if ((local_70.ptr.isSet == true) && (local_70.ptr.field_1.value.buffer.ptr != (uchar *)0x0)) {
    local_70.ptr.field_1.value.buffer.ptr = (uchar *)0x0;
    local_70.ptr.field_1.value.buffer.size_ = 0;
    (**(local_70.ptr.field_1.value.buffer.disposer)->_vptr_ArrayDisposer)
              (local_70.ptr.field_1.value.buffer.disposer,uVar10,1,uVar11,uVar11,0);
  }
  RVar9.super_PromiseBase.node.ptr = paf_1.promise.super_PromiseBase.node.ptr;
  pSVar13[2].content.size_ = (size_t)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
  pSVar13[3].content.ptr = (char *)this_00;
  pSVar13[3].content.size_ = (size_t)paf_1.fulfiller.disposer;
  pSVar13[4].content.ptr = (char *)paf_1.fulfiller.ptr;
  paf_1.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
  if (paf_1.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    paf_1.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)RVar9.super_PromiseBase.node.ptr);
  }
  *(undefined1 *)&pSVar13[4].content.size_ = 1;
  *(int *)&pSVar13[1].content.ptr = *(int *)&pSVar13[1].content.ptr + 2;
  pAVar1 = (Array<char> *)pSVar13[3].content.ptr;
  local_a8 = (ArrayDisposer *)operator_new(0x28);
  local_a8->_vptr_ArrayDisposer = (_func_int **)&PTR___cxa_pure_virtual_006299b8;
  local_a8[1]._vptr_ArrayDisposer = (_func_int **)psVar17;
  local_a8[2]._vptr_ArrayDisposer = (_func_int **)pSVar13;
  local_a8[3]._vptr_ArrayDisposer = (_func_int **)pSVar13[2].content.size_;
  local_a8[4]._vptr_ArrayDisposer = (_func_int **)pAVar1;
  pSVar13[3].content.ptr = (char *)0x0;
  local_a0 = (Array<char> *)0x1;
  if (pAVar1 != (Array<char> *)0x0) {
    local_a0 = pAVar1;
  }
  local_a8->_vptr_ArrayDisposer = (_func_int **)&PTR_disposeImpl_00641958;
  plVar2 = *(long **)(CONCAT44(in_register_00000034,__fd) + 8);
  pcVar19 = hostCopy.content.ptr;
  if (hostCopy.content.size_ == 0) {
    pcVar19 = "";
  }
  local_40[0] = *in_R9;
  local_38 = *(undefined8 *)(in_R9 + 8);
  (**(code **)(*plVar2 + 8))
            (&local_180,plVar2,pcVar19,hostCopy.content.size_ + (hostCopy.content.size_ == 0),
             headersCopy.ptr,local_a0,pSVar13,local_40);
  PVar5.node.ptr = local_180.node.ptr;
  local_e0._16_8_ = hostCopy.content.ptr;
  local_e0._24_8_ = hostCopy.content.size_;
  local_e0._32_8_ = hostCopy.content.disposer;
  hostCopy.content.ptr = (char *)0x0;
  hostCopy.content.size_ = 0;
  local_e0._40_8_ = headersCopy.disposer;
  pHStack_b0 = headersCopy.ptr;
  headersCopy.ptr = (HttpHeaders *)0x0;
  pPVar3 = *(PromiseArena **)((long)local_180.node.ptr + 8);
  local_e0._0_8_ = psVar17;
  local_e0._8_8_ = pSVar13;
  if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_180.node.ptr - (long)pPVar3) < 0x70) {
    pvVar14 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar14 + 0x390);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_180.node,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar14 + 0x390) = &PTR_destroy_006419d8;
    *(undefined8 *)((long)pvVar14 + 0x3b8) = local_e0._0_8_;
    *(undefined8 *)((long)pvVar14 + 0x3c0) = local_e0._8_8_;
    *(undefined8 *)((long)pvVar14 + 0x3c8) = local_e0._16_8_;
    *(undefined8 *)((long)pvVar14 + 0x3d0) = local_e0._24_8_;
    *(undefined8 *)((long)pvVar14 + 0x3d8) = local_e0._32_8_;
    *(undefined8 *)((long)pvVar14 + 0x3e0) = local_e0._40_8_;
    *(HttpHeaders **)((long)pvVar14 + 1000) = pHStack_b0;
    *(ArrayDisposer **)((long)pvVar14 + 0x3f0) = local_a8;
    *(Array<char> **)((long)pvVar14 + 0x3f8) = local_a0;
    *(void **)((long)pvVar14 + 0x398) = pvVar14;
  }
  else {
    *(PromiseArena **)((long)local_180.node.ptr + 8) = (PromiseArena *)0x0;
    this_01 = (TransformPromiseNodeBase *)((long)local_180.node.ptr + -0x70);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_180.node,kj::_::IdentityFunc<void>::operator());
    ((PromiseArenaMember *)((long)PVar5.node.ptr + -0x70))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006419d8;
    *(undefined8 *)((long)PVar5.node.ptr + -0x48) = local_e0._0_8_;
    ((PromiseArenaMember *)((long)PVar5.node.ptr + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)local_e0._8_8_;
    *(undefined8 *)((long)PVar5.node.ptr + -0x38) = local_e0._16_8_;
    ((PromiseArenaMember *)((long)PVar5.node.ptr + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)local_e0._24_8_;
    *(undefined8 *)((long)PVar5.node.ptr + -0x28) = local_e0._32_8_;
    ((PromiseArenaMember *)((long)PVar5.node.ptr + -0x20))->_vptr_PromiseArenaMember =
         (_func_int **)local_e0._40_8_;
    *(HttpHeaders **)((long)PVar5.node.ptr + -0x18) = pHStack_b0;
    ((PromiseArenaMember *)((long)PVar5.node.ptr + -0x10))->_vptr_PromiseArenaMember =
         (_func_int **)local_a8;
    *(Array<char> **)((long)PVar5.node.ptr + -8) = local_a0;
    *(PromiseArena **)((long)PVar5.node.ptr + -0x68) = pPVar3;
  }
  local_a0 = (Array<char> *)0x0;
  pHStack_b0 = (HttpHeaders *)0x0;
  local_e0._24_8_ = (ArrayDisposer *)0x0;
  local_e0._16_8_ = 0;
  local_e0._8_8_ = (StringPtr *)0x0;
  local_70.ptr._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_70.ptr.field_1.value.buffer.ptr = "connect";
  local_70.ptr.field_1.value.buffer.size_ = 0x1400001a7b;
  local_178.disposer = (Disposer *)this_01;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&paf_1,(OwnPromiseNode *)&local_178,(SourceLocation *)&local_70);
  RVar9 = paf_1.promise;
  node = local_178.disposer;
  if ((TransformPromiseNodeBase *)local_178.disposer != (TransformPromiseNodeBase *)0x0) {
    local_178.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  (anonymous_namespace)::HttpClientAdapter::
  connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::Exception&&)#1}
  ::~Exception((_lambda_kj__Exception____1_ *)local_e0);
  PVar5.node.ptr = local_180.node.ptr;
  if (local_180.node.ptr != (PromiseNode *)0x0) {
    local_180.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar5.node.ptr);
  }
  pHVar12 = local_80;
  pAVar6 = pipe.ends[1].ptr;
  (local_80->super_HttpClient)._vptr_HttpClient =
       (_func_int **)paf.promise.super_PromiseBase.node.ptr;
  paf.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  pHVar15 = (HttpService *)operator_new(0x20);
  pPVar7 = paf.fulfiller.ptr;
  pHVar15->_vptr_HttpService = (_func_int **)&PTR___cxa_pure_virtual_006299b8;
  pHVar15[1]._vptr_HttpService = (_func_int **)RVar9.super_PromiseBase.node.ptr;
  pHVar15[2]._vptr_HttpService = (_func_int **)pipe.ends[1].disposer;
  pHVar15[3]._vptr_HttpService = (_func_int **)pipe.ends[1].ptr;
  pipe.ends[1].ptr = (AsyncIoStream *)0x0;
  pHVar15->_vptr_HttpService = (_func_int **)&PTR_disposeImpl_006445d8;
  pAVar18 = (AsyncIoStream *)0x1;
  if (pAVar6 != (AsyncIoStream *)0x0) {
    pAVar18 = pAVar6;
  }
  pHVar12->service = pHVar15;
  pHVar12[1].super_HttpClient._vptr_HttpClient = (_func_int **)pAVar18;
  if (paf.fulfiller.ptr != (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0) {
    paf.fulfiller.ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0;
    (**(paf.fulfiller.disposer)->_vptr_Disposer)
              (paf.fulfiller.disposer,
               (pPVar7->super_PromiseRejector)._vptr_PromiseRejector[-2] +
               (long)&(pPVar7->super_PromiseRejector)._vptr_PromiseRejector);
  }
  node_00.super_PromiseBase.node.ptr = paf.promise.super_PromiseBase.node.ptr;
  if (paf.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    paf.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.super_PromiseBase.node.ptr);
  }
  lVar20 = 0x10;
  do {
    plVar2 = *(long **)((long)&pipe.ends[0].ptr + lVar20);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)&pipe.ends[0].ptr + lVar20) = 0;
      puVar4 = *(undefined8 **)((long)&pipe.ends[0].disposer + lVar20);
      (**(code **)*puVar4)(puVar4,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    lVar20 = lVar20 + -0x10;
  } while (lVar20 != -0x10);
  if (headersCopy.ptr != (HttpHeaders *)0x0) {
    headersCopy.ptr = (HttpHeaders *)0x0;
    (**(headersCopy.disposer)->_vptr_Disposer)();
  }
  sVar8 = hostCopy.content.size_;
  pcVar19 = hostCopy.content.ptr;
  if (hostCopy.content.ptr != (char *)0x0) {
    hostCopy.content.ptr = (char *)0x0;
    hostCopy.content.size_ = 0;
    (**(hostCopy.content.disposer)->_vptr_ArrayDisposer)
              (hostCopy.content.disposer,pcVar19,1,sVar8,sVar8,0);
  }
  return (int)pHVar12;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    // We have to clone the host and the headers because HttpServer implementation are allowed to
    // assusme that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto hostCopy = kj::str(host);
    auto headersCopy = kj::heap(headers.clone());

    // 1. Create a new TwoWayPipe, one will be returned with the ConnectRequest,
    //    the other will be held by the ConnectResponseImpl.
    auto pipe = kj::newTwoWayPipe();

    // 2. Create a promise/fulfiller pair for the status. The promise will be
    //    returned with the ConnectResponse, the fulfiller will be held by the
    //    ConnectResponseImpl.
    auto paf = kj::newPromiseAndFulfiller<ConnectRequest::Status>();

    // 3. Create the ConnectResponseImpl
    auto response = kj::refcounted<ConnectResponseImpl>(kj::mv(paf.fulfiller),
                                                        kj::mv(pipe.ends[0]));

    // 5. Call service.connect, passing in the tunnel.
    //    The call to tunnel->getConnectStream() returns a guarded stream that will buffer
    //    writes until the status is indicated by calling accept/reject.
    auto connectStream = response->getConnectStream();
    auto promise = service.connect(hostCopy, *headersCopy, *connectStream, *response, settings)
        .eagerlyEvaluate([response=kj::mv(response),
                          host=kj::mv(hostCopy),
                          headers=kj::mv(headersCopy),
                          connectStream=kj::mv(connectStream)](kj::Exception&& ex) mutable {
      // A few things need to happen here.
      //   1. We'll log the exception.
      //   2. We'll break the pipe.
      //   3. We'll reject the status promise if it is still pending.
      //
      // We'll do all of this within the ConnectResponseImpl, however, since it
      // maintains the state necessary here.
      response->handleException(kj::mv(ex), kj::mv(connectStream));
    });

    // TODO(bug): There's a challenge with attaching the service.connect promise to the
    // connection stream below in that the client will likely drop the connection as soon
    // as it reads EOF, but the promise representing the service connect() call may still
    // be running and want to do some cleanup after it has sent EOF. That cleanup will be
    // canceled. For regular HTTP calls, DelayedEofInputStream was created to address this
    // exact issue but with connect() being bidirectional it's rather more difficult. We
    // want a delay similar to what DelayedEofInputStream adds but only when both directions
    // have been closed. That currently is not possible until we have an alternative to
    // shutdownWrite() that returns a Promise (e.g. Promise<void> end()). For now, we can
    // live with the current limitation.
    return ConnectRequest {
      kj::mv(paf.promise),
      pipe.ends[1].attach(kj::mv(promise)),
    };
  }